

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm-posix.c
# Opt level: O0

PShm * p_shm_new(pchar *name,psize size,PShmAccessPerms perms,PError **error)

{
  pboolean pVar1;
  size_t sVar2;
  char *__dest;
  pchar *ppVar3;
  pchar *new_name;
  PShm *ret;
  PError **error_local;
  PShmAccessPerms perms_local;
  psize size_local;
  pchar *name_local;
  
  if (name == (pchar *)0x0) {
    p_error_set_error_p(error,0x25f,0,"Invalid input argument");
    name_local = (pchar *)0x0;
  }
  else {
    name_local = (pchar *)p_malloc0(0x30);
    if ((PShm *)name_local == (PShm *)0x0) {
      p_error_set_error_p(error,0x25c,0,"Failed to allocate memory for shared segment");
      name_local = (pchar *)0x0;
    }
    else {
      sVar2 = strlen(name);
      __dest = (char *)p_malloc0(sVar2 + 0xe);
      if (__dest == (char *)0x0) {
        p_error_set_error_p(error,0x25c,0,"Failed to allocate memory for segment name");
        p_shm_free((PShm *)name_local);
        name_local = (pchar *)0x0;
      }
      else {
        strcpy(__dest,name);
        strcat(__dest,"_p_shm_object");
        ppVar3 = p_ipc_get_platform_key(__dest,1);
        ((PShm *)name_local)->platform_key = ppVar3;
        ((PShm *)name_local)->perms = perms;
        ((PShm *)name_local)->size = size;
        p_free(__dest);
        pVar1 = pp_shm_create_handle((PShm *)name_local,error);
        if (pVar1 == 0) {
          p_shm_free((PShm *)name_local);
          name_local = (pchar *)0x0;
        }
        else if (size < ((PShm *)name_local)->size && size != 0) {
          ((PShm *)name_local)->size = size;
        }
      }
    }
  }
  return (PShm *)name_local;
}

Assistant:

P_LIB_API PShm *
p_shm_new (const pchar		*name,
	   psize		size,
	   PShmAccessPerms	perms,
	   PError		**error)
{
	PShm	*ret;
	pchar	*new_name;

	if (P_UNLIKELY (name == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PShm))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for shared segment");
		return NULL;
	}

	if (P_UNLIKELY ((new_name = p_malloc0 (strlen (name) + strlen (P_SHM_SUFFIX) + 1)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for segment name");
		p_shm_free (ret);
		return NULL;
	}

	strcpy (new_name, name);
	strcat (new_name, P_SHM_SUFFIX);

#if defined (P_OS_IRIX) || defined (P_OS_TRU64)
	/* IRIX and Tru64 prefer filename styled IPC names */
	ret->platform_key = p_ipc_get_platform_key (new_name, FALSE);
#else
	ret->platform_key = p_ipc_get_platform_key (new_name, TRUE);
#endif
	ret->perms = perms;
	ret->size  = size;

	p_free (new_name);

	if (P_UNLIKELY (pp_shm_create_handle (ret, error) == FALSE)) {
		p_shm_free (ret);
		return NULL;
	}

	if (P_LIKELY (ret->size > size && size != 0))
		ret->size = size;

	return ret;
}